

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::verifyRenderResult
          (GridRenderCase *this,IterationConfig *config)

{
  IVec2 *viewportSize;
  ostringstream *poVar1;
  uint uVar2;
  size_type sVar3;
  RenderContext *context;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar7;
  TestLog *pTVar8;
  size_t __n;
  ConstPixelBufferAccess *pCVar9;
  LogImageSet *access;
  bool bVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int iVar11;
  allocator<char> local_4a6;
  allocator<char> local_4a5;
  allocator<char> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  IVec4 viewportBBoxArea;
  Surface viewportSurface;
  IVec4 viewportGridInnerArea;
  IVec4 viewportGridOuterArea;
  Surface errorMask;
  ProjectedBBox projectedBBox;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  ConstPixelBufferAccess local_368;
  ConstPixelBufferAccess local_340;
  LogImageSet local_318;
  LogImage local_2d8;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  projectBoundingBox(&projectedBBox,&config->bbox);
  viewportSize = &config->viewportSize;
  getViewportBoundingBoxArea((anon_unknown_1 *)&viewportBBoxArea,&projectedBBox,viewportSize,0.0);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)&viewportGridOuterArea,&config->patternPos,&config->patternSize,
             viewportSize,ROUND_OUTWARDS);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)&viewportGridInnerArea,&config->patternPos,&config->patternSize,
             viewportSize,ROUND_INWARDS);
  tcu::Surface::Surface
            (&viewportSurface,(config->viewportSize).m_data[0],(config->viewportSize).m_data[1]);
  tcu::Surface::Surface
            (&errorMask,(config->viewportSize).m_data[0],(config->viewportSize).m_data[1]);
  if (*(char *)((long)&this->m_program + 3) == '\0') {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Projected bounding box: (clip space)\n");
    std::operator<<((ostream *)poVar1,"\tx: [");
    std::ostream::operator<<(poVar1,projectedBBox.min.m_data[0]);
    std::operator<<((ostream *)poVar1,",");
    std::ostream::operator<<(poVar1,projectedBBox.max.m_data[0]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"\ty: [");
    std::ostream::operator<<(poVar1,projectedBBox.min.m_data[1]);
    std::operator<<((ostream *)poVar1,",");
    std::ostream::operator<<(poVar1,projectedBBox.max.m_data[1]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"\tz: [");
    std::ostream::operator<<(poVar1,projectedBBox.min.m_data[2]);
    std::operator<<((ostream *)poVar1,",");
    std::ostream::operator<<(poVar1,projectedBBox.max.m_data[2]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"In viewport coordinates:\n");
    std::operator<<((ostream *)poVar1,"\tx: [");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[0]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[2]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"\ty: [");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[1]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[3]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"Verifying render results within the bounding box.\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Verifying render result.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  sVar3 = this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length;
  if (sVar3 != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar5) + 0x78))(0x8ca8,*(undefined4 *)(sVar3 + 0x10));
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (config->viewportPos).m_data[0];
  iVar6 = (config->viewportPos).m_data[1];
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&viewportSurface);
  glu::readPixels(context,iVar5,iVar6,(PixelBufferAccess *)local_1b0);
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
  local_2d8.m_name._M_dataplus._M_p = (pointer)0x0;
  local_2d8.m_name._M_string_length = 0xff00000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)&local_2d8);
  __n = 0;
  uVar7 = (ulong)(uint)viewportBBoxArea.m_data[1];
  if (viewportBBoxArea.m_data[1] < 1) {
    uVar7 = __n;
  }
  bVar10 = false;
  do {
    iVar5 = (config->viewportSize).m_data[1];
    if (viewportBBoxArea.m_data[3] < iVar5) {
      iVar5 = viewportBBoxArea.m_data[3];
    }
    iVar6 = (int)uVar7;
    if (iVar5 <= iVar6) {
      if (bVar10) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Image verification failed.");
        pTVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"Images",&local_4a1)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"Image verification",&local_4a2);
        tcu::LogImageSet::LogImageSet(&local_318,&local_408,&local_428);
        iVar5 = (int)pTVar8;
        tcu::LogImageSet::write(&local_318,iVar5,__buf,__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"Viewport",&local_4a3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"Viewport contents",&local_4a4);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_340,&viewportSurface);
        pCVar9 = &local_340;
        tcu::LogImage::LogImage
                  (&local_2d8,&local_388,&local_3a8,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d8,iVar5,__buf_00,(size_t)pCVar9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"ErrorMask",&local_4a5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e8,"Error mask",&local_4a6);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_368,&errorMask);
        pCVar9 = &local_368;
        tcu::LogImage::LogImage
                  (&local_240,&local_3c8,&local_3e8,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_240,iVar5,__buf_01,(size_t)pCVar9);
        tcu::TestLog::endImageSet(pTVar8);
        tcu::LogImage::~LogImage(&local_240);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3c8);
        tcu::LogImage::~LogImage(&local_2d8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_388);
        tcu::LogImageSet::~LogImageSet(&local_318);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image verification failed");
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Result image ok.");
        pTVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,"Images",(allocator<char> *)&local_388);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_368,"Image verification",(allocator<char> *)&local_3a8);
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&local_240,(string *)&local_340,(string *)&local_368);
        tcu::LogImageSet::write((LogImageSet *)&local_240,(int)pTVar8,__buf_02,__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"Viewport",(allocator<char> *)&local_3c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"Viewport contents",(allocator<char> *)&local_3e8);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_318,&viewportSurface);
        access = &local_318;
        tcu::LogImage::LogImage
                  (&local_2d8,&local_408,&local_428,(ConstPixelBufferAccess *)access,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d8,(int)pTVar8,__buf_03,(size_t)access);
        tcu::TestLog::endImageSet(pTVar8);
        tcu::LogImage::~LogImage(&local_2d8);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_408);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&viewportSurface);
      return;
    }
    uVar7 = (ulong)(uint)viewportBBoxArea.m_data[0];
    if (viewportBBoxArea.m_data[0] < 1) {
      uVar7 = __n;
    }
    while( true ) {
      iVar5 = viewportSize->m_data[0];
      if (viewportBBoxArea.m_data[2] < viewportSize->m_data[0]) {
        iVar5 = viewportBBoxArea.m_data[2];
      }
      iVar11 = (int)uVar7;
      if (iVar5 <= iVar11) break;
      bVar4 = true;
      if (((viewportGridOuterArea.m_data[0] <= iVar11) && (viewportGridOuterArea.m_data[1] <= iVar6)
          ) && (iVar11 <= viewportGridOuterArea.m_data[2])) {
        bVar4 = viewportGridOuterArea.m_data[3] < iVar6;
      }
      uVar2 = *(uint *)((long)viewportSurface.m_pixels.m_ptr +
                       (long)(viewportSurface.m_width * iVar6 + iVar11) * 4);
      if (((viewportGridInnerArea.m_data[0] < iVar11) && (viewportGridInnerArea.m_data[1] < iVar6))
         && (iVar11 < viewportGridInnerArea.m_data[2])) {
        if (bVar4) {
          if ((uVar2 & 0xffffff) != 0) {
LAB_013874df:
            *(undefined4 *)
             ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar6 + iVar11) * 4) =
                 0xff0000ff;
            bVar10 = true;
          }
        }
        else if ((iVar6 < viewportGridInnerArea.m_data[3]) && ((uVar2 & 0xffff00) != 0xff00))
        goto LAB_013874df;
      }
      else if ((bool)(bVar4 & (uVar2 & 0xffffff) != 0)) goto LAB_013874df;
      uVar7 = (ulong)(iVar11 + 1);
    }
    uVar7 = (ulong)(iVar6 + 1);
  } while( true );
}

Assistant:

void GridRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const ProjectedBBox		projectedBBox			= projectBoundingBox(config.bbox);
	const tcu::IVec4		viewportBBoxArea		= getViewportBoundingBoxArea(projectedBBox, config.viewportSize);
	const tcu::IVec4		viewportGridOuterArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_OUTWARDS);
	const tcu::IVec4		viewportGridInnerArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	tcu::Surface			viewportSurface			(config.viewportSize.x(), config.viewportSize.y());
	tcu::Surface			errorMask				(config.viewportSize.x(), config.viewportSize.y());
	bool					anyError				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box.\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result."
			<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	tcu::clear(errorMask.getAccess(), tcu::IVec4(0,0,0,255));

	for (int y = de::max(viewportBBoxArea.y(), 0); y < de::min(viewportBBoxArea.w(), config.viewportSize.y()); ++y)
	for (int x = de::max(viewportBBoxArea.x(), 0); x < de::min(viewportBBoxArea.z(), config.viewportSize.x()); ++x)
	{
		const tcu::RGBA	pixel		= viewportSurface.getPixel(x, y);
		const bool		outsideGrid	= x < viewportGridOuterArea.x() ||
									  y < viewportGridOuterArea.y() ||
									  x > viewportGridOuterArea.z() ||
									  y > viewportGridOuterArea.w();
		const bool		insideGrid	= x > viewportGridInnerArea.x() &&
									  y > viewportGridInnerArea.y() &&
									  x < viewportGridInnerArea.z() &&
									  y < viewportGridInnerArea.w();

		bool			error		= false;

		if (outsideGrid)
		{
			// expect black
			if (pixel.getRed() != 0 || pixel.getGreen() != 0 || pixel.getBlue() != 0)
				error = true;
		}

		else if (insideGrid)
		{
			// expect green, yellow or a combination of these
			if (pixel.getGreen() != 255 || pixel.getBlue() != 0)
				error = true;
		}
		else
		{
			// boundary, allow anything
		}

		if (error)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			anyError = true;
		}
	}

	if (anyError)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}